

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLWriter::Attribute<unsigned_int>(cmXMLWriter *this,char *name,uint *value)

{
  uint uVar1;
  ostream *poVar2;
  uint *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  PreAttribute(this);
  poVar2 = std::operator<<(this->Output,name);
  poVar2 = std::operator<<(poVar2,"=\"");
  uVar1 = SafeAttribute<unsigned_int>(*value);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }